

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

PrimitivePortSymbol * __thiscall
slang::BumpAllocator::
emplace<slang::ast::PrimitivePortSymbol,slang::ast::Compilation&,char_const(&)[1],slang::SourceLocation_const&,slang::ast::PrimitivePortDirection&>
          (BumpAllocator *this,Compilation *args,char (*args_1) [1],SourceLocation *args_2,
          PrimitivePortDirection *args_3)

{
  PrimitivePortSymbol *this_00;
  size_t sVar1;
  string_view name;
  
  this_00 = (PrimitivePortSymbol *)allocate(this,0x158,8);
  sVar1 = strlen(*args_1);
  name._M_str = *args_1;
  name._M_len = sVar1;
  ast::PrimitivePortSymbol::PrimitivePortSymbol(this_00,args,name,*args_2,*args_3);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }